

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::AdapterPromiseNode<kj::_::Void,_kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedSend>::
destroy(AdapterPromiseNode<kj::_::Void,_kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedSend>
        *this)

{
  WebSocketPipeImpl *pWVar1;
  
  pWVar1 = (this->adapter).pipe;
  if ((BlockedSend *)(pWVar1->state).ptr == &this->adapter) {
    (pWVar1->state).ptr = (WebSocket *)0x0;
  }
  Canceler::~Canceler(&(this->adapter).canceler);
  if ((this->adapter).message.tag - 1 < 3) {
    (this->adapter).message.tag = 0;
  }
  NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&this->result);
  AsyncObject::~AsyncObject((AsyncObject *)&this->super_PromiseFulfiller<void>);
  AsyncObject::~AsyncObject((AsyncObject *)this);
  return;
}

Assistant:

void destroy() override { freePromise(this); }